

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-hex.c
# Opt level: O2

void test_hex_decode(void)

{
  int iVar1;
  size_t sVar2;
  char hex [35];
  char buffer [256];
  
  builtin_strncpy(hex,"000102030405060708090a0B0c0D0e0fFf",0x23);
  sVar2 = strlen(hex);
  iVar1 = hex_decode(hex,(uint)sVar2,buffer,0x100);
  acutest_check_((uint)(iVar1 == 0x11),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-hex.c"
                 ,0x37,"%s","hex_decode(hex, strlen(hex), buffer, sizeof(buffer)) == sizeof(expect)"
                );
  iVar1 = bcmp(buffer,&DAT_001050a0,0x11);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-hex.c"
                 ,0x38,"%s","memcmp(buffer, expect, sizeof(expect)) == 0");
  return;
}

Assistant:

static void
test_hex_decode(void)
{
    /* Keep the visually ugly mixed lower and upper case here. */
    char hex[] = "000102030405060708090a0B0c0D0e0fFf";
    char buffer[256];
    char expect[] = { 0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15, 0xff };

    TEST_CHECK(hex_decode(hex, strlen(hex), buffer, sizeof(buffer)) == sizeof(expect));
    TEST_CHECK(memcmp(buffer, expect, sizeof(expect)) == 0);
}